

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef expr,char *name)

{
  size_t this;
  bool bVar1;
  string_view local_40;
  size_t local_30;
  size_t index;
  ArenaVector<wasm::Name> *list;
  Expression *expression;
  char *name_local;
  BinaryenExpressionRef expr_local;
  
  list = (ArenaVector<wasm::Name> *)expr;
  expression = (Expression *)name;
  name_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::Switch>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x88d,
                  "BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef, const char *)");
  }
  if (expression != (Expression *)0x0) {
    index = (size_t)&(list->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).
                     allocatedElements;
    local_30 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                         ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)index);
    this = index;
    wasm::Name::Name((Name *)&local_40,(char *)expression);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)this,(Name)local_40);
    return (BinaryenIndex)local_30;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x88e,"BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef, const char *)"
               );
}

Assistant:

BinaryenIndex BinaryenSwitchAppendName(BinaryenExpressionRef expr,
                                       const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(name);
  auto& list = static_cast<Switch*>(expression)->targets;
  auto index = list.size();
  list.push_back(name);
  return index;
}